

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O0

void __thiscall
cfd::js::api::json::BlindRawTransactionRequest::ConvertFromStruct
          (BlindRawTransactionRequest *this,BlindRawTransactionRequestStruct *data)

{
  BlindRawTransactionRequestStruct *data_local;
  BlindRawTransactionRequest *this_local;
  
  std::__cxx11::string::operator=((string *)&this->tx_,(string *)data);
  core::JsonObjectVector<cfd::js::api::json::BlindTxInRequest,_cfd::js::api::BlindTxInRequestStruct>
  ::ConvertFromStruct(&this->txins_,&data->txins);
  core::
  JsonObjectVector<cfd::js::api::json::BlindTxOutRequest,_cfd::js::api::BlindTxOutRequestStruct>::
  ConvertFromStruct(&this->txouts_,&data->txouts);
  core::
  JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ConvertFromStruct(&this->txout_confidential_addresses_,&data->txout_confidential_addresses);
  core::
  JsonObjectVector<cfd::js::api::json::BlindIssuanceRequest,_cfd::js::api::BlindIssuanceRequestStruct>
  ::ConvertFromStruct(&this->issuances_,&data->issuances);
  this->minimum_range_value_ = data->minimum_range_value;
  this->exponent_ = data->exponent;
  this->minimum_bits_ = data->minimum_bits;
  this->collect_blinder_ = (bool)(data->collect_blinder & 1);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->ignore_items,&data->ignore_items);
  return;
}

Assistant:

void BlindRawTransactionRequest::ConvertFromStruct(
    const BlindRawTransactionRequestStruct& data) {
  tx_ = data.tx;
  txins_.ConvertFromStruct(data.txins);
  txouts_.ConvertFromStruct(data.txouts);
  txout_confidential_addresses_.ConvertFromStruct(
      data.txout_confidential_addresses);
  issuances_.ConvertFromStruct(data.issuances);
  minimum_range_value_ = data.minimum_range_value;
  exponent_ = data.exponent;
  minimum_bits_ = data.minimum_bits;
  collect_blinder_ = data.collect_blinder;
  ignore_items = data.ignore_items;
}